

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbuffer.c
# Opt level: O1

entry_t * bounded_buffer_get(bounded_buffer_t *bb)

{
  pthread_mutex_t *__mutex;
  entry_t *peVar1;
  int iVar2;
  int iVar3;
  
  __mutex = &bb->lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  iVar2 = bb->head;
  if (bb->tail == iVar2) {
    do {
      pthread_cond_wait((pthread_cond_t *)&bb->has_items,(pthread_mutex_t *)__mutex);
      iVar2 = bb->head;
    } while (bb->tail == iVar2);
  }
  iVar3 = iVar2 % bb->size;
  peVar1 = bb->entries[iVar3];
  bb->head = iVar2 + 1;
  bb->entries[iVar3] = (entry_t *)0x0;
  pthread_cond_signal((pthread_cond_t *)&bb->has_space);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return peVar1;
}

Assistant:

entry_t* bounded_buffer_get(bounded_buffer_t* bb)
{
    pthread_mutex_lock(&bb->lock);

    while (bb->tail == bb->head)
    {
        pthread_cond_wait(&bb->has_items, &bb->lock);
    }

    entry_t* entry = bb->entries[bb->head % bb->size];
    bb->entries[bb->head++ % bb->size] = NULL;
    pthread_cond_signal(&bb->has_space);

    pthread_mutex_unlock(&bb->lock);
    return entry;
}